

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O0

void __thiscall
sigslot::
_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::disconnect_all(_signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                 *this)

{
  bool bVar1;
  reference pp_Var2;
  has_slots<sigslot::multi_threaded_local> *this_00;
  iterator local_68;
  const_iterator local_60;
  iterator local_58;
  const_iterator local_50 [3];
  iterator local_38;
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  local_30;
  const_iterator itEnd;
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  local_20;
  const_iterator it;
  lock_block<sigslot::multi_threaded_local> lock;
  _signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  *this_local;
  
  lock_block<sigslot::multi_threaded_local>::lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it,(multi_threaded_local *)this);
  itEnd._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::begin(&this->m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&local_20,(iterator *)&itEnd);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::end(&this->m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&local_30,&local_38);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pp_Var2 = std::
              _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
              ::operator*(&local_20);
    this_00 = (has_slots<sigslot::multi_threaded_local> *)(**(code **)(*(long *)*pp_Var2 + 0x10))();
    has_slots<sigslot::multi_threaded_local>::signal_disconnect
              (this_00,&this->super__signal_base<sigslot::multi_threaded_local>);
    pp_Var2 = std::
              _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
              ::operator*(&local_20);
    if (*pp_Var2 !=
        (_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
         *)0x0) {
      (**(code **)(*(long *)*pp_Var2 + 8))();
    }
    std::
    _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
    ::operator++(&local_20);
  }
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::begin(&this->m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(local_50,&local_58);
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
       ::end(&this->m_connected_slots);
  std::
  _List_const_iterator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>
  ::_List_const_iterator(&local_60,&local_68);
  std::__cxx11::
  list<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
  ::erase(&this->m_connected_slots,local_50[0],local_60);
  lock_block<sigslot::multi_threaded_local>::~lock_block
            ((lock_block<sigslot::multi_threaded_local> *)&it);
  return;
}

Assistant:

void disconnect_all()
		{
			lock_block<mt_policy> lock(this);
			const_iterator it = m_connected_slots.begin();
			const_iterator itEnd = m_connected_slots.end();

			while(it != itEnd)
			{
				(*it)->getdest()->signal_disconnect(this);
				delete *it;

				++it;
			}

			m_connected_slots.erase(m_connected_slots.begin(), m_connected_slots.end());
		}